

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  XMLGrammarPoolImpl *this;
  long lVar4;
  ThreadParser *this_00;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ThreadInfo *pTVar8;
  bool bVar9;
  char *pcVar10;
  int *piVar11;
  ulong uVar12;
  double dVar13;
  
  parseCommandLine(argc,argv);
  uVar7 = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (((gRunInfo.doSchema == true) && (gRunInfo.doNamespaces == true)) &&
     (gRunInfo.doGrammarCaching == true)) {
    gpMemMgr = (MemoryManager *)operator_new(8);
    gpMemMgr->_vptr_MemoryManager =
         (_func_int **)&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports;
    this = (XMLGrammarPoolImpl *)xercesc_4_0::XMemory::operator_new((XMemory *)0x40,uVar7);
    xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(this,gpMemMgr);
    gRunInfo.doInitialParse = true;
    gp = (XMLGrammarPool *)this;
  }
  ReadFilesIntoMemory();
  lVar4 = (long)gRunInfo.numInputFiles;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&gRunInfo.files[0].checkSum + lVar5) = 0;
      lVar5 = lVar5 + 0x28;
    } while (lVar4 * 0x28 != lVar5);
  }
  if (gRunInfo.doInitialParse != false) {
    this_00 = (ThreadParser *)operator_new(0x40);
    ThreadParser::ThreadParser(this_00);
    if (gRunInfo.numInputFiles < 1) {
      ThreadParser::~ThreadParser(this_00);
      operator_delete(this_00,0x40);
      iVar3 = 0;
    }
    else {
      piVar11 = &gRunInfo.files[0].checkSum;
      bVar9 = false;
      lVar4 = 0;
      do {
        pcVar10 = ((InFileInfo *)(piVar11 + -8))->fileName;
        if (gRunInfo.verbose == true) {
          printf("%s checksum is ",pcVar10);
        }
        uVar2 = ThreadParser::parse(this_00,(int)lVar4);
        if (uVar2 == 0) {
          fprintf(_stderr,"An error occurred while initially parsing %s\n",pcVar10);
          bVar9 = true;
        }
        *piVar11 = uVar2;
        if (gRunInfo.verbose == true) {
          printf("%x\n",(ulong)uVar2);
        }
        if (((gRunInfo.dumpOnErr == true) && (bVar9)) && (gRunInfo.dom == true)) {
          ThreadParser::domPrint(this_00);
        }
        lVar4 = lVar4 + 1;
        piVar11 = piVar11 + 10;
      } while (lVar4 < gRunInfo.numInputFiles);
      ThreadParser::~ThreadParser(this_00);
      operator_delete(this_00,0x40);
      iVar3 = 0;
      if (bVar9) {
        main_cold_1();
        iVar3 = 1;
      }
    }
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  uVar7 = (ulong)gRunInfo.numThreads;
  if (uVar7 == 0) {
    clearFileInfoMemory();
    exit(0);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
    uVar12 = SUB168(auVar1 * ZEXT816(0xc),0);
  }
  gThreadInfo = (ThreadInfo *)operator_new__(uVar12);
  pTVar8 = gThreadInfo;
  do {
    pTVar8->fHeartBeat = false;
    pTVar8->fInProgress = false;
    pTVar8->fParses = 0;
    pTVar8->fThreadNum = -1;
    pTVar8 = pTVar8 + 1;
  } while (pTVar8 != gThreadInfo + uVar7);
  if (0 < gRunInfo.numThreads) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pTVar8 = gThreadInfo;
      *(int *)((long)&gThreadInfo->fThreadNum + lVar4) = (int)lVar5;
      ThreadFuncs::startThread(threadMain,&pTVar8->fHeartBeat + lVar4);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar5 < gRunInfo.numThreads);
  }
  if (gRunInfo.numParses == 0) {
    lVar4 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    if (-1 < gRunInfo.totalTime) {
      do {
        sleep(1);
        if (gRunInfo.verbose == false && gRunInfo.quiet == false) {
          if (0 < (long)gRunInfo.numThreads) {
            lVar5 = 0;
            do {
              if ((&gThreadInfo->fHeartBeat)[lVar5] == false) {
                fputc(0x2e,_stdout);
                fflush(_stdout);
                goto LAB_0010715c;
              }
              lVar5 = lVar5 + 0xc;
            } while ((long)gRunInfo.numThreads * 0xc != lVar5);
          }
          fputc(0x2b,_stdout);
          fflush(_stdout);
          pTVar8 = gThreadInfo;
          lVar5 = (long)gRunInfo.numThreads;
          if (0 < lVar5) {
            lVar6 = 0;
            do {
              (&pTVar8->fHeartBeat)[lVar6] = false;
              lVar6 = lVar6 + 0xc;
            } while (lVar5 * 0xc != lVar6);
          }
        }
LAB_0010715c:
        lVar5 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      } while ((gRunInfo.totalTime == 0) ||
              ((int)((ulong)(lVar5 - lVar4) / 1000) < gRunInfo.totalTime));
    }
  }
  else {
    do {
      sleep(1);
      if ((long)gRunInfo.numThreads < 1) break;
      lVar4 = 0;
      bVar9 = false;
      do {
        if (*(uint *)((long)&gThreadInfo->fParses + lVar4) < gRunInfo.numParses) {
          bVar9 = true;
        }
        lVar4 = lVar4 + 0xc;
      } while ((long)gRunInfo.numThreads * 0xc != lVar4);
    } while (bVar9);
  }
  gRunInfo.stopNow = true;
  uVar7 = (ulong)(uint)gRunInfo.numThreads;
  if (0 < gRunInfo.numThreads) {
    uVar12 = 0;
    do {
      if (gThreadInfo[uVar12].fInProgress == true) {
        do {
          sleep(1);
        } while (gThreadInfo[uVar12].fInProgress != false);
      }
      if (gRunInfo.verbose == true) {
        printf("Thread #%d: is finished.\n",uVar12 & 0xffffffff);
      }
      uVar12 = uVar12 + 1;
      uVar7 = (ulong)gRunInfo.numThreads;
    } while ((long)uVar12 < (long)uVar7);
  }
  if ((int)uVar7 < 1) {
    dVar13 = 0.0;
  }
  else {
    dVar13 = 0.0;
    lVar4 = 0;
    do {
      dVar13 = dVar13 + (double)*(uint *)((long)&gThreadInfo->fParses + lVar4);
      lVar4 = lVar4 + 0xc;
    } while ((uVar7 & 0xffffffff) * 0xc != lVar4);
  }
  if (gRunInfo.quiet == false) {
    if (gRunInfo.numParses == 0) {
      dVar13 = dVar13 / ((double)gRunInfo.totalTime / 60.0);
      pcVar10 = "\n%8.2f parses per minute.\n";
    }
    else {
      pcVar10 = "\n%8.0f total parses were completed.\n";
    }
    printf(pcVar10,dVar13);
  }
  if ((gp != (XMLGrammarPool *)0x0) &&
     ((**(code **)(*(long *)gp + 8))(), gpMemMgr != (MemoryManager *)0x0)) {
    (*gpMemMgr->_vptr_MemoryManager[1])();
  }
  xercesc_4_0::XMLPlatformUtils::Terminate();
  clearFileInfoMemory();
  if (gThreadInfo != (ThreadInfo *)0x0) {
    operator_delete__(gThreadInfo);
  }
  puts("Test Run Successfully");
  return 0;
}

Assistant:

int main (int argc, char **argv)
{


    parseCommandLine(argc, argv);

    //
    // Initialize the XML system.
    //
    try
    {
         XMLPlatformUtils::Initialize();
    }
    catch (...)
    {
        fprintf(stderr, "Exception from XMLPlatfromUtils::Initialize.\n");
        return 1;
    }


    /** Grammar caching thread testing */
    // Initialize memory manger and grammar pool
    // set doInitialParse to true so that the first parse will cache the
    // grammar and it'll be used in subsequent parses

    if (gRunInfo.doSchema == true && gRunInfo.doNamespaces == true && gRunInfo.doGrammarCaching == true) {
        gpMemMgr = new MemoryManagerImpl();
        gp = new XMLGrammarPoolImpl(gpMemMgr);
        gRunInfo.doInitialParse = true;
    }

    //
    // If we will be parsing from memory, read each of the input files
    //  into memory now.
    //
    ReadFilesIntoMemory();

    // Initialize checksums to zero so we can check first parse and if
    // zero then we need to move first parse's checksum into array. This
    // is for the cse where we skip the initial parse.
    for (int n = 0; n < gRunInfo.numInputFiles; n++)
    {
        gRunInfo.files[n].checkSum = 0;
    }

    if (gRunInfo.doInitialParse)
    {
    //
    // While we are still single threaded, parse each of the documents
    // once, to check for errors, and to note the checksum.
    // Blow off the rest of the test if there are errors.
    //
        ThreadParser *mainParser = new ThreadParser;
        int     n;
        bool    errors = false;
        int     cksum;

        for (n = 0; n < gRunInfo.numInputFiles; n++)
        {
            char *fileName = gRunInfo.files[n].fileName;
            if (gRunInfo.verbose)
                printf("%s checksum is ", fileName);

            cksum = mainParser->parse(n);

            if (cksum == 0) {
                fprintf(stderr, "An error occurred while initially parsing %s\n",
                    fileName);
                errors = true;
            };

            gRunInfo.files[n].checkSum = cksum;
            if (gRunInfo.verbose )
                printf("%x\n", cksum);
            if (gRunInfo.dumpOnErr && errors && gRunInfo.dom) {
                mainParser->domPrint();
            }

        }
        delete mainParser;

        if (errors) {
            fprintf(stderr, "Quitting due to error incurred during initial parse\n");
            clearFileInfoMemory();
            return 1;
        }
    }

    //
    //  Fire off the requested number of parallel threads
    //

    if (gRunInfo.numThreads == 0) {
        clearFileInfoMemory();
        exit(0);
    }

    gThreadInfo = new ThreadInfo[gRunInfo.numThreads];

    int threadNum;
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
    {
        gThreadInfo[threadNum].fThreadNum = threadNum;
        ThreadFuncs::startThread(threadMain, &gThreadInfo[threadNum]);
    }

    if (gRunInfo.numParses)
    {
        bool notDone;
        while (true)
        {
            ThreadFuncs::Sleep(1000);
            notDone = false;

            for (threadNum = 0; threadNum < gRunInfo.numThreads; threadNum++) {
                if (gThreadInfo[threadNum].fParses < gRunInfo.numParses)
                    notDone = true;
            }
            if (notDone == false) {
                break;
            }
        }
    }
    else
    {
        //
        //  Loop, watching the heartbeat of the worker threads.
        //    Each second, display "+" when all threads have completed a parse
        //                 display "." if some thread hasn't since previous "+"
        //

        unsigned long startTime = XMLPlatformUtils::getCurrentMillis();
        int elapsedSeconds = 0;
        while (gRunInfo.totalTime == 0 || gRunInfo.totalTime > elapsedSeconds) {
            ThreadFuncs::Sleep(1000);
            if (gRunInfo.quiet == false && gRunInfo.verbose == false) {
                char c = '+';
                for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
                    if (gThreadInfo[threadNum].fHeartBeat == false) {
                        c = '.';
                        break;
                    }
                }
                fputc(c, stdout);
                fflush(stdout);
                if (c == '+')
                    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
                        gThreadInfo[threadNum].fHeartBeat = false;
            }
            elapsedSeconds = (XMLPlatformUtils::getCurrentMillis() - startTime) / 1000;
        }
    }

    //
    //  Time's up, we are done.  (We only get here if this was a timed run)
    //  Tally up the total number of parses completed by each of the threads.
    //
    gRunInfo.stopNow = true;      // set flag, which will cause worker threads to stop.

    //
    //  Make sure all threads are done before terminate
    //
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
        while (gThreadInfo[threadNum].fInProgress == true) {
            ThreadFuncs::Sleep(1000);
        }
        if (gRunInfo.verbose)
            printf("Thread #%d: is finished.\n", threadNum);
    }

    //
    //  We are done!   Count the number of parse and terminate the program
    //
    double totalParsesCompleted = 0;
    for (threadNum=0; threadNum < gRunInfo.numThreads; threadNum++)
    {
        totalParsesCompleted += gThreadInfo[threadNum].fParses;
        // printf("%f   ", totalParsesCompleted);
    }

    if (gRunInfo.quiet == false) {
        if (gRunInfo.numParses) {
            printf("\n%8.0f total parses were completed.\n", totalParsesCompleted);
        }
        else {
            double parsesPerMinute = totalParsesCompleted / (double(gRunInfo.totalTime) / double(60));
            printf("\n%8.2f parses per minute.\n", parsesPerMinute);
        }
    }

    // delete grammar pool and memory manager
    if (gp) {
        delete gp;
        delete gpMemMgr;
    }

    XMLPlatformUtils::Terminate();

    clearFileInfoMemory();

    delete [] gThreadInfo;

    printf("Test Run Successfully\n");

    return 0;
}